

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPF.cpp
# Opt level: O0

void __thiscall
OpenMD::RNEMD::SPFMethod::doRNEMDImpl
          (SPFMethod *this,SelectionManager *smanA,SelectionManager *smanB)

{
  bool bVar1;
  int iVar2;
  long in_RDI;
  Molecule *selectedMolecule;
  RealType fixedChargeOnIon;
  Vector3d angMom_1;
  Vector3d angMom;
  StuntDouble *sd;
  int selej;
  int selei;
  Vector3d vel;
  RealType b;
  RealType a;
  Vector3d v_b;
  Vector3d v_a;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  SelectionManager *in_stack_fffffffffffffde0;
  SimInfo *this_00;
  SelectionManager *in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 in_stack_fffffffffffffdf4;
  Molecule *in_stack_fffffffffffffe00;
  Globals *local_1e0;
  element_type *local_1d8;
  SPFMethod *in_stack_fffffffffffffee0;
  RealType *in_stack_fffffffffffffee8;
  Vector3d *in_stack_fffffffffffffef0;
  Vector3d *in_stack_fffffffffffffef8;
  SPFMethod *in_stack_ffffffffffffff00;
  StuntDouble *local_80;
  
  if ((*(byte *)(in_RDI + 0x288) & 1) != 0) {
    bVar1 = SPFForceManager::getHasSelectedMolecule(*(SPFForceManager **)(in_RDI + 0x22b0));
    if (!bVar1) {
      selectMolecule(in_stack_fffffffffffffee0);
    }
    if (*(double *)(in_RDI + 0x1f88) <= 0.0) {
      SelectionManager::operator-=
                ((SelectionManager *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8);
    }
    else {
      SelectionManager::operator-=
                ((SelectionManager *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 in_stack_fffffffffffffde8);
    }
    SelectionManager::operator=
              (in_stack_fffffffffffffde0,
               (SelectionManager *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    SelectionManager::operator=
              (in_stack_fffffffffffffde0,
               (SelectionManager *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    if ((*(byte *)(in_RDI + 0x28f1) & 1) == 0) {
      Vector3<double>::Vector3((Vector3<double> *)0x412c14);
      Vector3<double>::Vector3((Vector3<double> *)0x412c21);
      isValidExchange(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                      in_stack_fffffffffffffee8,(RealType *)in_stack_fffffffffffffee0);
      Vector3<double>::Vector3((Vector3<double> *)0x412c70);
      local_80 = SelectionManager::beginSelected
                           (in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
      while (local_80 != (StuntDouble *)0x0) {
        StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffffde8);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (double)in_stack_fffffffffffffde0);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffde8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        StuntDouble::setVel((StuntDouble *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (Vector3d *)in_stack_fffffffffffffde8);
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffde0);
        if (bVar1) {
          StuntDouble::getJ((StuntDouble *)in_stack_fffffffffffffde8);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                            (double)in_stack_fffffffffffffde0);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffde0,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          StuntDouble::setJ((StuntDouble *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (Vector3d *)in_stack_fffffffffffffde8);
        }
        local_80 = SelectionManager::nextSelected
                             (in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
      }
      local_80 = SelectionManager::beginSelected
                           (in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
      while (local_80 != (StuntDouble *)0x0) {
        StuntDouble::getVel((StuntDouble *)in_stack_fffffffffffffde8);
        OpenMD::operator-((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (double)in_stack_fffffffffffffde0);
        OpenMD::operator+((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                          (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        Vector3<double>::operator=
                  ((Vector3<double> *)in_stack_fffffffffffffde8,
                   (Vector<double,_3U> *)in_stack_fffffffffffffde0);
        StuntDouble::setVel((StuntDouble *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (Vector3d *)in_stack_fffffffffffffde8);
        bVar1 = StuntDouble::isDirectional((StuntDouble *)in_stack_fffffffffffffde0);
        if (bVar1) {
          StuntDouble::getJ((StuntDouble *)in_stack_fffffffffffffde8);
          OpenMD::operator*((Vector<double,_3U> *)in_stack_fffffffffffffde8,
                            (double)in_stack_fffffffffffffde0);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_fffffffffffffde0,
                     (Vector<double,_3U> *)
                     CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
          StuntDouble::setJ((StuntDouble *)
                            CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                            (Vector3d *)in_stack_fffffffffffffde8);
        }
        local_80 = SelectionManager::nextSelected
                             (in_stack_fffffffffffffde8,(int *)in_stack_fffffffffffffde0);
      }
      if ((*(byte *)(in_RDI + 0x28a) & 1) == 0) {
        *(double *)(in_RDI + 0x2f0) = *(double *)(in_RDI + 0x1f88) + *(double *)(in_RDI + 0x2f0);
      }
      else {
        local_1d8 = (element_type *)0x0;
        local_1e0 = (Globals *)
                    SPFForceManager::getSelectedMolecule(*(SPFForceManager **)(in_RDI + 0x22b0));
        if (local_1e0 != (Globals *)0x0) {
          local_1d8 = (element_type *)Molecule::getFixedCharge(in_stack_fffffffffffffe00);
        }
        this_00 = (SimInfo *)&stack0xfffffffffffffe10;
        Snapshot::getSPFData
                  ((Snapshot *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
        std::__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<OpenMD::SPFData,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                   )0x412f9c);
        iVar2 = SimInfo::getMolToProc(this_00,in_stack_fffffffffffffddc);
        MPI_Bcast(&stack0xfffffffffffffe28,1,&ompi_mpi_double,iVar2,&ompi_mpi_comm_world);
        std::shared_ptr<OpenMD::SPFData>::~shared_ptr((shared_ptr<OpenMD::SPFData> *)0x412fdc);
        *(double *)(in_RDI + 0x2f0) =
             *(double *)(in_RDI + 0x1f88) * (double)local_1d8 + *(double *)(in_RDI + 0x2f0);
      }
      *(double *)(in_RDI + 0x2e8) = *(double *)(in_RDI + 0x2a8) + *(double *)(in_RDI + 0x2e8);
    }
    else {
      *(int *)(in_RDI + 0x32c) = *(int *)(in_RDI + 0x32c) + 1;
    }
    *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0xa71) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0xa72) = 0;
    *(undefined1 *)(*(long *)(in_RDI + 0x10) + 0xa74) = 0;
  }
  return;
}

Assistant:

void SPFMethod::doRNEMDImpl(SelectionManager& smanA,
                              SelectionManager& smanB) {
    if (!doRNEMD_) return;

    if (!forceManager_->getHasSelectedMolecule()) { selectMolecule(); }

    // Remove selected molecule from the source selection manager
    if (spfTarget_ > 0.0) {
      smanA -= selectedMoleculeMan_;
    } else {
      smanB -= selectedMoleculeMan_;
    }

    smanA_ = smanA;
    smanB_ = smanB;

    if (!failedLastTrial_) {
      Vector3d v_a {};
      Vector3d v_b {};
      RealType a {0.0};
      RealType b {0.0};

      isValidExchange(v_a, v_b, a, b);

      Vector3d vel;

      int selei {}, selej {};
      StuntDouble* sd;

      for (sd = smanA.beginSelected(selei); sd != NULL;
           sd = smanA.nextSelected(selei)) {
        vel = (sd->getVel() - v_a) * a + v_a;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * a;
          sd->setJ(angMom);
        }
      }

      for (sd = smanB.beginSelected(selej); sd != NULL;
           sd = smanB.nextSelected(selej)) {
        vel = (sd->getVel() - v_b) * b + v_b;
        sd->setVel(vel);

        if (sd->isDirectional()) {
          Vector3d angMom = sd->getJ() * b;
          sd->setJ(angMom);
        }
      }

      if (useChargedSPF_) {
        RealType fixedChargeOnIon {};

        if (Molecule* selectedMolecule = forceManager_->getSelectedMolecule();
            selectedMolecule) {
          fixedChargeOnIon = selectedMolecule->getFixedCharge();
        }

#ifdef IS_MPI
        MPI_Bcast(&fixedChargeOnIon, 1, MPI_REALTYPE,
                  info_->getMolToProc(currentSnap_->getSPFData()->globalID),
                  MPI_COMM_WORLD);
#endif

        particleExchange_ += spfTarget_ * fixedChargeOnIon;
      } else {
        particleExchange_ += spfTarget_;
      }

      kineticExchange_ += kineticTarget_;
    } else {
      failTrialCount_++;
    }

    currentSnap_->hasTranslationalKineticEnergy = false;
    currentSnap_->hasRotationalKineticEnergy    = false;
    currentSnap_->hasKineticEnergy              = false;
  }